

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

int Mf_ManTruthCanonicize(word *t,int nVars)

{
  bool bVar1;
  ulong uVar2;
  word wVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar;
  ulong uVar8;
  word Truth;
  
  uVar7 = (ulong)(uint)nVars;
  bVar4 = (byte)nVars;
  if (nVars < 1) {
    nVars = 0;
  }
  bVar1 = true;
  uVar6 = 0;
  wVar3 = *t;
  while (bVar1) {
    uVar2 = ~wVar3;
    uVar8 = 0;
    Truth = wVar3;
    if (uVar2 <= wVar3) {
      Truth = uVar2;
    }
    uVar5 = 0;
    if (uVar2 < wVar3) {
      uVar5 = 1 << (bVar4 & 0x1f);
    }
    uVar6 = uVar6 ^ uVar5;
    while (iVar = (int)uVar8, nVars != iVar) {
      uVar7 = uVar8;
      wVar3 = Abc_Tt6Flip(Truth,iVar);
      uVar5 = 1 << ((byte)uVar8 & 0x1f);
      if (Truth <= wVar3) {
        uVar5 = 0;
      }
      if (wVar3 <= Truth) {
        Truth = wVar3;
      }
      uVar6 = uVar6 ^ uVar5;
      uVar8 = (ulong)(iVar + 1);
    }
    bVar1 = false;
    wVar3 = Truth;
  }
  *t = wVar3;
  if (s_vTtMem == (Vec_Mem_t *)0x0) {
    s_vTtMem = Vec_MemAllocForTT(6,(int)uVar7);
  }
  Vec_MemHashInsert(s_vTtMem,t);
  s_nCalls = s_nCalls + 1;
  return uVar6;
}

Assistant:

int Mf_ManTruthCanonicize( word * t, int nVars )
{
    word Temp, Best = *t;
    int r, i, Config = 0;
    for ( r = 0; r < 1; r++ )
    {
        if ( Best > (Temp = ~Best) )
            Best = Temp, Config ^= (1 << nVars);
        for ( i = 0; i < nVars; i++ )
            if ( Best > (Temp = Abc_Tt6Flip(Best, i)) )
                Best = Temp, Config ^= (1 << i);
    }
    *t = Best;
    if ( s_vTtMem == NULL )
        s_vTtMem = Vec_MemAllocForTT( 6, 0 );
    Vec_MemHashInsert( s_vTtMem, t );
    s_nCalls++;
    return Config;
}